

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::predict_or_learn_bag<true>(cb_explore *data,single_learner *base,example *ec)

{
  single_learner *psVar1;
  uint64_t *puVar2;
  ulong uVar3;
  bool bVar4;
  single_learner *psVar5;
  uint64_t uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  action_scores probs;
  action_score local_70;
  polyprediction *local_68;
  single_learner *local_60;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_58._begin = (action_score *)(ec->pred).scalars._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  if ((data->cbcs).num_actions != 0) {
    uVar7 = 0;
    do {
      local_70.score = 0.0;
      local_70.action = uVar7;
      v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_70);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (data->cbcs).num_actions);
  }
  local_68 = &ec->pred;
  uVar3 = data->bag_size;
  if (uVar3 != 0) {
    local_60 = base + 0x30;
    psVar1 = base + 0x28;
    uVar10 = 0;
    do {
      fVar11 = merand48(&data->all->random_state);
      bVar4 = false;
      iVar8 = 0;
      psVar5 = local_60;
      if (0.36787945 < fVar11) {
        psVar5 = psVar1;
        if (fVar11 <= 0.7357589) {
          iVar8 = 1;
          bVar4 = false;
        }
        else {
          iVar8 = 2;
          bVar4 = true;
          if (((((((0.9196986 < fVar11) && (iVar8 = 3, 0.98101187 < fVar11)) &&
                 (iVar8 = 4, 0.99634016 < fVar11)) &&
                ((iVar8 = 5, 0.9994058 < fVar11 && (iVar8 = 6, 0.99991673 < fVar11)))) &&
               ((iVar8 = 7, 0.99998975 < fVar11 &&
                ((iVar8 = 8, 0.99999887 < fVar11 && (iVar8 = 9, 0.9999999 < fVar11)))))) &&
              (iVar8 = 10, 1.0 < fVar11)) &&
             ((((iVar8 = 0xb, 1.0 < fVar11 && (iVar8 = 0xc, 1.0 < fVar11)) &&
               (iVar8 = 0xd, 1.0 < fVar11)) &&
              (((iVar8 = 0xe, 1.0 < fVar11 && (iVar8 = 0xf, 1.0 < fVar11)) &&
               ((iVar8 = 0x10, 1.0 < fVar11 &&
                ((iVar8 = 0x11, 1.0 < fVar11 && (iVar8 = 0x12, 1.0 < fVar11)))))))))) {
            iVar8 = 0x14;
          }
        }
      }
      iVar9 = (int)uVar10;
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar9);
      (**(code **)psVar5)(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar9);
      uVar7 = (ec->pred).multiclass - 1;
      local_58._begin[uVar7].score = local_58._begin[uVar7].score + 1.0 / (float)uVar3;
      if (bVar4) {
        uVar6 = (ec->super_example_predict).ft_offset;
        iVar8 = iVar8 + -1;
        do {
          (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * iVar9) + uVar6;
          (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          uVar6 = (ec->super_example_predict).ft_offset -
                  (ulong)(uint)(*(int *)(base + 0xe0) * iVar9);
          (ec->super_example_predict).ft_offset = uVar6;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < data->bag_size);
  }
  (local_68->scalars).end_array = (float *)local_58.end_array;
  (local_68->scalars).erase_count = local_58.erase_count;
  (local_68->a_s)._begin = local_58._begin;
  (local_68->scalars)._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  action_scores probs = ec.pred.a_s;
  probs.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
  float prob = 1.f / (float)data.bag_size;
  for (size_t i = 0; i < data.bag_size; i++)
  {
    uint32_t count = BS::weight_gen(*data.all);
    if (is_learn && count > 0)
      base.learn(ec, i);
    else
      base.predict(ec, i);
    uint32_t chosen = ec.pred.multiclass - 1;
    probs[chosen].score += prob;
    if (is_learn)
      for (uint32_t j = 1; j < count; j++) base.learn(ec, i);
  }

  ec.pred.a_s = probs;
}